

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-attr.cpp
# Opt level: O2

void __thiscall yactfr::internal::TsdlAttr::throwUnknown(TsdlAttr *this)

{
  string msg;
  ostream *poVar1;
  ostringstream ss;
  undefined8 in_stack_fffffffffffffe40;
  TextLocation in_stack_fffffffffffffe48;
  TextLocation local_1a0;
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"Unknown attribute `");
  poVar1 = std::operator<<(poVar1,(string *)&this->name);
  std::operator<<(poVar1,"`.");
  std::__cxx11::stringbuf::str();
  nameTextLoc(&local_1a0,this);
  msg._M_string_length = local_1a0._lineNumber;
  msg._M_dataplus._M_p = (pointer)local_1a0._offset;
  msg.field_2._M_allocated_capacity = local_1a0._colNumber;
  msg.field_2._8_8_ = in_stack_fffffffffffffe40;
  throwTextParseError(msg,in_stack_fffffffffffffe48);
}

Assistant:

void TsdlAttr::throwUnknown() const
{
    std::ostringstream ss;

    ss << "Unknown attribute `" << name << "`.";
    throwTextParseError(ss.str(), this->nameTextLoc());
}